

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_case.cc
# Opt level: O0

void __thiscall CaseField::GenInitCode(CaseField *this,Output *out_cc,Env *env)

{
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  
  (**(code **)(**(long **)(in_RDI + 0x68) + 0x30))(*(long **)(in_RDI + 0x68),in_RSI,in_RDX);
  return;
}

Assistant:

void CaseField::GenInitCode(Output* out_cc, Env* env)
	{
	// GenCaseStr(index_, out_cc, env);
	// out_cc->inc_indent();
	// out_cc->println("{");
	// out_cc->println("// Initialize \"%s\"", id_->Name());
	type_->GenInitCode(out_cc, env);
	// out_cc->println("}");
	// out_cc->println("break;");
	// out_cc->dec_indent();
	}